

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<FileInfoCacheKey,_QFileInfo>_>::freeData
          (Span<QHashPrivate::Node<FileInfoCacheKey,_QFileInfo>_> *this)

{
  byte bVar1;
  void *pvVar2;
  Node<FileInfoCacheKey,_QFileInfo> *pNVar3;
  Node<FileInfoCacheKey,_QFileInfo> *in_RDI;
  uchar o;
  uchar *__end4;
  uchar *__begin4;
  uchar (*__range4) [128];
  Node<FileInfoCacheKey,_QFileInfo> *local_18;
  
  if (in_RDI[2].key.hash != 0) {
    pNVar3 = in_RDI + 2;
    for (local_18 = in_RDI; local_18 != pNVar3;
        local_18 = (Node<FileInfoCacheKey,_QFileInfo> *)((long)&(local_18->key).hash + 1)) {
      bVar1 = (byte)(local_18->key).hash;
      if (bVar1 != 0xff) {
        Entry::node((Entry *)(in_RDI[2].key.hash + (ulong)bVar1 * 0x40));
        Node<FileInfoCacheKey,_QFileInfo>::~Node(in_RDI);
      }
    }
    pvVar2 = (void *)in_RDI[2].key.hash;
    if (pvVar2 != (void *)0x0) {
      operator_delete__(pvVar2);
    }
    in_RDI[2].key.hash = 0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }